

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffuptf(fitsfile *fptr,int *status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long rownum;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  LONGLONG naxis2;
  LONGLONG length;
  long tflds;
  LONGLONG addr;
  char newform [71];
  char tform [71];
  char comment [73];
  char keyname [75];
  char lenval [40];
  char message [81];
  char card [81];
  double local_2b8;
  long local_2a8;
  fitsfile *local_2a0;
  long local_298;
  long local_290;
  byte local_288;
  byte bStack_287;
  byte bStack_286;
  byte bStack_285;
  byte bStack_284;
  byte bStack_283;
  byte bStack_282;
  byte bStack_281;
  byte bStack_280;
  byte bStack_27f;
  byte bStack_27e;
  byte bStack_27d;
  byte bStack_27c;
  byte bStack_27b;
  byte bStack_27a;
  byte bStack_279;
  byte local_278;
  byte bStack_277;
  byte bStack_276;
  byte bStack_275;
  byte bStack_274;
  byte bStack_273;
  byte bStack_272;
  byte bStack_271;
  byte bStack_270;
  byte bStack_26f;
  byte bStack_26e;
  byte bStack_26d;
  byte bStack_26c;
  byte bStack_26b;
  byte bStack_26a;
  byte bStack_269;
  LONGLONG local_260;
  undefined2 local_258 [40];
  byte local_208;
  byte bStack_207;
  byte bStack_206;
  byte bStack_205;
  byte bStack_204;
  byte bStack_203;
  byte bStack_202;
  byte bStack_201;
  char local_1b8 [80];
  char local_168 [80];
  char local_118 [48];
  char local_e8 [96];
  char local_88 [88];
  
  ffmaky(fptr,2,status);
  ffgkyjj(fptr,"NAXIS2",&local_2a8,local_1b8,status);
  ffgkyj(fptr,"TFIELDS",&local_290,local_1b8,status);
  if (0 < local_290) {
    local_278 = 0xfe;
    bStack_277 = 0xfe;
    bStack_276 = 0xfe;
    bStack_275 = 0xfe;
    bStack_274 = 0;
    bStack_273 = 0;
    bStack_272 = 0;
    bStack_271 = 0;
    bStack_270 = 0;
    bStack_26f = 0;
    bStack_26e = 0;
    bStack_26d = 0;
    bStack_26c = 0;
    bStack_26b = 0;
    bStack_26a = 0;
    bStack_269 = 0;
    local_288 = 0x50;
    bStack_287 = 0x50;
    bStack_286 = 0x50;
    bStack_285 = 0x50;
    bStack_284 = 0;
    bStack_283 = 0;
    bStack_282 = 0;
    bStack_281 = 0;
    bStack_280 = 0;
    bStack_27f = 0;
    bStack_27e = 0;
    bStack_27d = 0;
    bStack_27c = 0;
    bStack_27b = 0;
    bStack_27a = 0;
    bStack_279 = 0;
    lVar8 = 1;
    local_2a0 = fptr;
    do {
      ffkeyn("TFORM",(int)lVar8,local_168,status);
      iVar2 = ffgkys(fptr,local_168,(char *)&local_208,local_1b8,status);
      if (0 < iVar2) {
        memcpy(local_e8,"Error while updating variable length vector TFORMn values (ffuptf).",0x44);
        ffxmsg(5,local_e8);
        break;
      }
      auVar9[0] = -((local_208 & local_278) == local_288);
      auVar9[1] = -((local_208 & bStack_277) == bStack_287);
      auVar9[2] = -((bStack_207 & bStack_276) == bStack_286);
      auVar9[3] = -((bStack_207 & bStack_275) == bStack_285);
      auVar9[4] = -((bStack_206 & bStack_274) == bStack_284);
      auVar9[5] = -((bStack_206 & bStack_273) == bStack_283);
      auVar9[6] = -((bStack_205 & bStack_272) == bStack_282);
      auVar9[7] = -((bStack_205 & bStack_271) == bStack_281);
      auVar9[8] = -((bStack_204 & bStack_270) == bStack_280);
      auVar9[9] = -((bStack_204 & bStack_26f) == bStack_27f);
      auVar9[10] = -((bStack_203 & bStack_26e) == bStack_27e);
      auVar9[0xb] = -((bStack_203 & bStack_26d) == bStack_27d);
      auVar9[0xc] = -((bStack_202 & bStack_26c) == bStack_27c);
      auVar9[0xd] = -((bStack_202 & bStack_26b) == bStack_27b);
      auVar9[0xe] = -((bStack_201 & bStack_26a) == bStack_27a);
      auVar9[0xf] = -((bStack_201 & bStack_269) == bStack_279);
      auVar9 = pshuflw(auVar9,auVar9,0x50);
      auVar10._0_4_ = auVar9._0_4_;
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = auVar9._4_4_;
      auVar10._12_4_ = auVar9._4_4_;
      iVar2 = movmskpd(iVar2,auVar10);
      if (iVar2 != 0) {
        if (local_2a8 < 1) {
          local_2b8 = 0.0;
        }
        else {
          rownum = 0;
          lVar7 = 0;
          do {
            rownum = rownum + 1;
            ffgdesll(fptr,(int)lVar8,rownum,&local_298,&local_260,status);
            if (lVar7 < local_298) {
              lVar7 = local_298;
            }
          } while (rownum < local_2a8);
          local_2b8 = (double)lVar7;
        }
        local_258[0] = 0x27;
        pcVar3 = strchr((char *)&local_208,0x28);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
        sVar4 = strlen((char *)&local_208);
        snprintf(local_118,0x28,"(%.0f)",local_2b8);
        sVar5 = strlen(local_118);
        if ((sVar5 + (long)(int)sVar4) - 0x45 < 0xffffffffffffffb9) {
          ffxmsg(5,"Error assembling TFORMn string (ffuptf).");
          *status = 0x105;
          return 0x105;
        }
        strcat((char *)local_258,(char *)&local_208);
        strcat((char *)local_258,local_118);
        uVar6 = strlen((char *)local_258);
        while (uVar6 < 9) {
          sVar4 = strlen((char *)local_258);
          *(undefined2 *)((long)local_258 + sVar4) = 0x20;
          uVar6 = strlen((char *)local_258);
        }
        sVar4 = strlen((char *)local_258);
        *(undefined2 *)((long)local_258 + sVar4) = 0x27;
        ffmkky(local_168,(char *)local_258,local_1b8,local_88,status);
        fptr = local_2a0;
        ffmkey(local_2a0,local_88,status);
      }
      bVar1 = lVar8 < local_290;
      lVar8 = lVar8 + 1;
    } while (bVar1);
  }
  return *status;
}

Assistant:

int ffuptf(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Update the value of the TFORM keywords for the variable length array
  columns to make sure they all have the form 1Px(len) or Px(len) where
  'len' is the maximum length of the vector in the table (e.g., '1PE(400)')
*/
{
    int ii, lenform=0;
    long tflds;
    LONGLONG length, addr, maxlen, naxis2, jj;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD];
    char tform[FLEN_VALUE], newform[FLEN_VALUE], lenval[40];
    char card[FLEN_CARD];
    char message[FLEN_ERRMSG];
    char *tmp;

    ffmaky(fptr, 2, status);         /* reset to beginning of header */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comment, status);
    ffgkyj(fptr, "TFIELDS", &tflds, comment, status);

    for (ii = 1; ii <= tflds; ii++)        /* loop over all the columns */
    {
      ffkeyn("TFORM", ii, keyname, status);          /* construct name */
      if (ffgkys(fptr, keyname, tform, comment, status) > 0)
      {
        snprintf(message,FLEN_ERRMSG,
        "Error while updating variable length vector TFORMn values (ffuptf).");
        ffpmsg(message);
        return(*status);
      }
      /* is this a variable array length column ? */
      if (tform[0] == 'P' || tform[1] == 'P' || tform[0] == 'Q' || tform[1] == 'Q')
      {
          /* get the max length */
          maxlen = 0;
          for (jj=1; jj <= naxis2; jj++)
          {
            ffgdesll(fptr, ii, jj, &length, &addr, status);

	    if (length > maxlen)
	         maxlen = length;
          }

          /* construct the new keyword value */
          strcpy(newform, "'");
          tmp = strchr(tform, '(');  /* truncate old length, if present */
          if (tmp) *tmp = 0;
          lenform = strlen(tform);

          /* print as double, because the string-to-64-bit */
          /* conversion is platform dependent (%lld, %ld, %I64d) */

          snprintf(lenval,40, "(%.0f)", (double) maxlen);
          
          if (lenform+strlen(lenval)+2 > FLEN_VALUE-1)
          {
             ffpmsg("Error assembling TFORMn string (ffuptf).");
             return(*status = BAD_TFORM);
          }
          strcat(newform, tform);

          strcat(newform,lenval);
          while(strlen(newform) < 9)
             strcat(newform," ");   /* append spaces 'till length = 8 */
          strcat(newform,"'" );     /* append closing parenthesis */
          /* would be simpler to just call ffmkyj here, but this */
          /* would force linking in all the modkey & putkey routines */
          ffmkky(keyname, newform, comment, card, status);  /* make new card */
          ffmkey(fptr, card, status);   /* replace last read keyword */
      }
    }
    return(*status);
}